

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Num.cpp
# Opt level: O2

Halves * __thiscall Num::getHalf(Halves *__return_storage_ptr__,Num *this,Short length)

{
  undefined6 in_register_00000012;
  Short i;
  ulong uVar1;
  Short i_2;
  ulong uVar2;
  string s2;
  string s1;
  string local_110;
  string local_f0;
  undefined1 local_d0 [40];
  undefined1 local_a8 [40];
  pair<Num,_Num> local_80;
  
  uVar2 = CONCAT62(in_register_00000012,length) >> 1 & 0x7fffffff;
  std::pair<Num,_Num>::pair<Num,_Num,_true>(__return_storage_ptr__);
  local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
  local_f0._M_string_length = 0;
  local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
  local_110._M_string_length = 0;
  local_f0.field_2._M_local_buf[0] = '\0';
  local_110.field_2._M_local_buf[0] = '\0';
  uVar1 = 0;
  if ((length & 1) == 0) {
    for (; uVar2 != uVar1; uVar1 = uVar1 + 1) {
      std::__cxx11::string::push_back((char)&local_f0);
    }
    for (; uVar2 < length; uVar2 = uVar2 + 1) {
      if (uVar2 < (ushort)(this->base)._M_string_length) {
        std::__cxx11::string::push_back((char)&local_110);
      }
    }
    Num((Num *)local_a8,&local_f0,(Short)local_f0._M_string_length);
    Num((Num *)local_d0,&local_110,(Short)local_110._M_string_length);
    std::pair<Num,_Num>::pair<Num,_Num,_true>(&local_80,(Num *)local_a8,(Num *)local_d0);
    std::pair<Num,_Num>::operator=(__return_storage_ptr__,&local_80);
  }
  else {
    for (; uVar2 != uVar1; uVar1 = uVar1 + 1) {
      std::__cxx11::string::push_back((char)&local_f0);
    }
    for (; uVar2 <= ((uint)CONCAT62(in_register_00000012,length) & 0xfffe); uVar2 = uVar2 + 1) {
      if (uVar2 < (ushort)(this->base)._M_string_length) {
        std::__cxx11::string::push_back((char)&local_110);
      }
    }
    Num((Num *)local_a8,&local_f0,(Short)local_f0._M_string_length);
    Num((Num *)local_d0,&local_110,(Short)local_110._M_string_length);
    std::pair<Num,_Num>::pair<Num,_Num,_true>(&local_80,(Num *)local_a8,(Num *)local_d0);
    std::pair<Num,_Num>::operator=(__return_storage_ptr__,&local_80);
  }
  std::pair<Num,_Num>::~pair(&local_80);
  std::__cxx11::string::~string((string *)(local_d0 + 8));
  std::__cxx11::string::~string((string *)(local_a8 + 8));
  std::__cxx11::string::~string((string *)&local_110);
  std::__cxx11::string::~string((string *)&local_f0);
  return __return_storage_ptr__;
}

Assistant:

Halves Num::getHalf(Short length) const  // separate number to halves and reсturn them as a pair of numbers
{
    Short k = length / 2;
    Halves pair;
    std::string s1, s2;
    if (length % 2)
    {
        for (Short i = 0; i < k; ++i)
            s1 += (Num::getDigit(i) + '0');
        for (Short i = k; i <= 2 * k; ++i)
            if (i < getSize())
            {
                s2 += (Num::getDigit(i) + '0');
            }


        pair = {Num(s1, s1.length()), Num(s2,s2.length())};

    }
    else
    {
        for (Short i = 0; i < k; ++i)
            s1 += (Num::getDigit(i) + '0');
        for (Short i = k; i < 2 * k; ++i)
            if (i < getSize())
            {
                s2 += (Num::getDigit(i) + '0');
            }


        pair = {Num(s1, s1.length()), Num(s2, s2.length())};
    }
    return pair;
}